

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRepresentation::~IfcRepresentation(IfcRepresentation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRepresentation_007ea4b8;
  *(undefined ***)&this->field_0x80 = &PTR__IfcRepresentation_007ea4e0;
  pLVar2 = (this->Items).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2,(long)(this->Items).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar2);
  }
  pcVar3 = (this->RepresentationType).ptr._M_dataplus._M_p;
  paVar1 = &(this->RepresentationType).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).field_0x18;
  if (puVar4 != &this->field_0x28) {
    operator_delete(puVar4,*(long *)&this->field_0x28 + 1);
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

IfcRepresentation() : Object("IfcRepresentation") {}